

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstddebug.cpp
# Opt level: O0

SQInteger debug_getbuildinfo(HSQUIRRELVM v)

{
  HSQUIRRELVM in_stack_00000020;
  SQChar *in_stack_00000028;
  HSQUIRRELVM in_stack_00000030;
  HSQUIRRELVM in_stack_00000038;
  
  sq_newtable(in_stack_00000020);
  sq_pushstring(in_stack_00000030,in_stack_00000028,(SQInteger)in_stack_00000020);
  sq_pushstring(in_stack_00000030,in_stack_00000028,(SQInteger)in_stack_00000020);
  sq_newslot(in_stack_00000038,(SQInteger)in_stack_00000030,(SQBool)in_stack_00000028);
  sq_pushstring(in_stack_00000030,in_stack_00000028,(SQInteger)in_stack_00000020);
  sq_pushinteger(in_stack_00000030,(SQInteger)in_stack_00000028);
  sq_newslot(in_stack_00000038,(SQInteger)in_stack_00000030,(SQBool)in_stack_00000028);
  sq_pushstring(in_stack_00000030,in_stack_00000028,(SQInteger)in_stack_00000020);
  sq_pushinteger(in_stack_00000030,(SQInteger)in_stack_00000028);
  sq_newslot(in_stack_00000038,(SQInteger)in_stack_00000030,(SQBool)in_stack_00000028);
  sq_pushstring(in_stack_00000030,in_stack_00000028,(SQInteger)in_stack_00000020);
  sq_pushinteger(in_stack_00000030,(SQInteger)in_stack_00000028);
  sq_newslot(in_stack_00000038,(SQInteger)in_stack_00000030,(SQBool)in_stack_00000028);
  sq_pushstring(in_stack_00000030,in_stack_00000028,(SQInteger)in_stack_00000020);
  sq_pushstring(in_stack_00000030,in_stack_00000028,(SQInteger)in_stack_00000020);
  sq_newslot(in_stack_00000038,(SQInteger)in_stack_00000030,(SQBool)in_stack_00000028);
  return 1;
}

Assistant:

static SQInteger debug_getbuildinfo(HSQUIRRELVM v)
{
  sq_newtable(v);
  sq_pushstring(v, _SC("version"), -1);
  sq_pushstring(v, SQUIRREL_VERSION, -1);
  sq_newslot(v, -3, SQFalse);
  sq_pushstring(v, _SC("charsize"), -1);
  sq_pushinteger(v, sizeof(SQChar));
  sq_newslot(v, -3, SQFalse);
  sq_pushstring(v, _SC("intsize"), -1);
  sq_pushinteger(v, sizeof(SQInteger));
  sq_newslot(v, -3, SQFalse);
  sq_pushstring(v, _SC("floatsize"), -1);
  sq_pushinteger(v, sizeof(SQFloat));
  sq_newslot(v, -3, SQFalse);
  sq_pushstring(v, _SC("gc"), -1);
#ifndef NO_GARBAGE_COLLECTOR
  sq_pushstring(v, _SC("enabled"), -1);
#else
  sq_pushstring(v, _SC("disabled"), -1);
#endif // NO_GARBAGE_COLLECTOR
  sq_newslot(v, -3, SQFalse);
  return 1;
}